

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O0

int main(void)

{
  SqStack P;
  SqStack P_00;
  SqStack P_01;
  SqStack P_02;
  SqStack S_00;
  SqStack s;
  ElementType *in_stack_ffffffffffffff60;
  ElementType *local_98;
  undefined8 local_90;
  undefined1 local_88 [24];
  undefined1 local_70 [24];
  undefined1 local_58 [24];
  undefined8 local_40;
  ElementType *local_38;
  ElementType *local_30;
  ElementType *local_28;
  SqStack S;
  
  S._20_4_ = 0;
  S_00.top = S.top;
  S_00.base = S.base;
  S_00._16_8_ = in_stack_ffffffffffffff60;
  InitStack(S_00);
  local_28 = (ElementType *)local_40;
  S.base = local_38;
  S.top = local_30;
  P.top = local_38;
  P.base = (ElementType *)local_40;
  P._16_8_ = local_30;
  Push((SqStack *)local_58,P,1);
  local_28 = (ElementType *)local_58._0_8_;
  S.base = (ElementType *)local_58._8_8_;
  S.top = (ElementType *)local_58._16_8_;
  P_00.top = (ElementType *)local_58._8_8_;
  P_00.base = (ElementType *)local_58._0_8_;
  P_00._16_8_ = local_58._16_8_;
  Push((SqStack *)local_70,P_00,2);
  local_28 = (ElementType *)local_70._0_8_;
  S.base = (ElementType *)local_70._8_8_;
  S.top = (ElementType *)local_70._16_8_;
  P_01.top = (ElementType *)local_70._8_8_;
  P_01.base = (ElementType *)local_70._0_8_;
  P_01._16_8_ = local_70._16_8_;
  Push((SqStack *)local_88,P_01,3);
  local_28 = (ElementType *)local_88._0_8_;
  S.base = (ElementType *)local_88._8_8_;
  S.top = (ElementType *)local_88._16_8_;
  P_02.top = (ElementType *)local_88._8_8_;
  P_02.base = (ElementType *)local_88._0_8_;
  P_02._16_8_ = local_88._16_8_;
  Push((SqStack *)&stack0xffffffffffffff60,P_02,4);
  s.top = (ElementType *)local_90;
  s.base = local_98;
  s._16_8_ = in_stack_ffffffffffffff60;
  PrintStackData(s);
  conversion();
  LineEdit();
  return 0;
}

Assistant:

int main(){
    SqStack S;
    S = InitStack(S);
    S = Push(S,1);
    S = Push(S,2);
    S = Push(S,3);
    S = Push(S,4);
    PrintStackData(S);
    conversion(10);
    LineEdit();
    return 0;
}